

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O2

void duckdb::ListReduceFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_449;
  _Function_base local_448;
  code *local_430;
  LogicalType local_428 [24];
  LogicalType local_410 [24];
  LogicalType local_3f8 [24];
  LogicalType local_3e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c8;
  LogicalType local_3b0 [24];
  ScalarFunction fun;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  duckdb::LogicalType::LogicalType(local_3e0,ANY);
  duckdb::LogicalType::LIST(local_428);
  duckdb::LogicalType::LogicalType(local_410,LAMBDA);
  __l._M_len = 2;
  __l._M_array = local_428;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3c8,__l,&local_449);
  duckdb::LogicalType::LogicalType(local_3f8,ANY);
  local_448._M_functor._8_8_ = 0;
  local_448._M_functor._M_unused._M_function_pointer = LambdaFunctions::ListReduceFunction;
  local_430 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_448._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&fun,&local_3c8,local_3f8,&local_448,ListReduceBind,0,0,0,local_3b0,0,0,0);
  duckdb::LogicalType::~LogicalType(local_3b0);
  std::_Function_base::~_Function_base(&local_448);
  duckdb::LogicalType::~LogicalType(local_3f8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c8);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_428 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_3e0);
  fun._169_1_ = 1;
  fun.serialize = ListLambdaBindData::Serialize;
  fun.deserialize = ListLambdaBindData::Deserialize;
  fun.bind_lambda = ListReduceBindLambda;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_148,&fun);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  duckdb::LogicalType::LogicalType(local_428,ANY);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&fun.field_0x48,
             local_428);
  duckdb::LogicalType::~LogicalType(local_428);
  ScalarFunction::ScalarFunction(&local_270,&fun);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  ScalarFunction::~ScalarFunction(&fun);
  return;
}

Assistant:

ScalarFunctionSet ListReduceFun::GetFunctions() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LAMBDA}, LogicalType::ANY,
	                   LambdaFunctions::ListReduceFunction, ListReduceBind, nullptr, nullptr);

	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = ListLambdaBindData::Serialize;
	fun.deserialize = ListLambdaBindData::Deserialize;
	fun.bind_lambda = ListReduceBindLambda;

	ScalarFunctionSet set;
	set.AddFunction(fun);
	fun.arguments.push_back(LogicalType::ANY);
	set.AddFunction(fun);
	return set;
}